

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintTupleTo<std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,3ul>
               (undefined8 param_1,ostream *param_2)

{
  ostream *in_stack_ffffffffffffffd8;
  int *in_stack_ffffffffffffffe0;
  
  PrintTupleTo<std::tuple<int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>,2ul>
            (param_1,param_2);
  std::operator<<(param_2,", ");
  std::get<2ul,int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>
            ((tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)> *)
             0xa73208);
  UniversalPrinter<int>::Print(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}